

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wiz-spoil.c
# Opt level: O3

void spoil_mon_desc(char *fname)

{
  wchar_t wVar1;
  monster_race *pmVar2;
  angband_constants *paVar3;
  monster_race *pmVar4;
  _Bool _Var5;
  void *base;
  size_t sVar6;
  uint uVar7;
  char **ppcVar8;
  ushort uVar9;
  long lVar10;
  char *fmt;
  char *pcVar11;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  char spd [80];
  char hp [80];
  char ac [80];
  char rar [80];
  char exp [80];
  char lev [80];
  char nam [80];
  char buf [1024];
  
  path_build(buf,0x400,ANGBAND_DIR_USER,fname);
  fh = file_open(buf,MODE_WRITE,FTYPE_TEXT);
  if (fh == (ang_file *)0x0) {
    pcVar11 = "Cannot create spoiler file.";
  }
  else {
    uVar12 = 0;
    file_putf(fh,"Monster Spoilers for %s\n",buildid);
    file_putf(fh,"------------------------------------------\n\n");
    file_putf(fh,"%-40.40s%4s%4s%6s%8s%4s  %11.11s\n","Name","Lev","Rar","Spd","Hp","Ac",
              "Visual Info");
    file_putf(fh,"%-40.40s%4s%4s%6s%8s%4s  %11.11s\n","----","---","---","---","--","--",
              "-----------");
    base = mem_zalloc((ulong)((uint)z_info->r_max * 2));
    paVar3 = z_info;
    uVar9 = z_info->r_max;
    if (uVar9 < 3) {
      sort(base,0,2,cmp_monsters);
    }
    else {
      ppcVar8 = &r_info[1].name;
      lVar13 = 1;
      do {
        if (*ppcVar8 != (char *)0x0) {
          lVar10 = (long)(int)uVar12;
          uVar12 = uVar12 + 1;
          *(short *)((long)base + lVar10 * 2) = (short)lVar13;
          uVar9 = paVar3->r_max;
        }
        lVar13 = lVar13 + 1;
        ppcVar8 = ppcVar8 + 0x1a;
      } while (lVar13 < (long)((ulong)uVar9 - 1));
      sort(base,(long)(int)uVar12,2,cmp_monsters);
      if (0 < (int)uVar12) {
        uVar14 = 0;
        do {
          pmVar4 = r_info;
          uVar9 = *(ushort *)((long)base + uVar14 * 2);
          pmVar2 = r_info + uVar9;
          pcVar11 = r_info[uVar9].name;
          _Var5 = flag_has_dbg(pmVar2->flags,0xb,2,"race->flags","RF_QUESTOR");
          fmt = "[Q] %s";
          if (!_Var5) {
            _Var5 = flag_has_dbg(pmVar2->flags,0xb,1,"race->flags","RF_UNIQUE");
            fmt = "The %s";
            if (_Var5) {
              fmt = "[U] %s";
            }
          }
          strnfmt(nam,0x50,fmt,pcVar11);
          strnfmt(lev,0x50,"%d",(ulong)(uint)pmVar4[uVar9].level);
          strnfmt(rar,0x50,"%d",(ulong)(uint)pmVar4[uVar9].rarity);
          wVar1 = pmVar4[uVar9].speed;
          if (wVar1 < L'n') {
            uVar7 = 0x6e - wVar1;
            pcVar11 = "-%d";
          }
          else {
            uVar7 = wVar1 + L'\xffffff92';
            pcVar11 = "+%d";
          }
          strnfmt(spd,0x50,pcVar11,(ulong)uVar7);
          strnfmt(ac,0x50,"%d",(ulong)(uint)pmVar4[uVar9].ac);
          strnfmt(hp,0x50,"%d",(ulong)(uint)pmVar4[uVar9].avg_hp);
          strnfmt(exp,0x50,"%ld",(long)pmVar4[uVar9].mexp);
          pcVar11 = attr_to_text(pmVar4[uVar9].d_attr);
          strnfmt(exp,0x50,"%s \'%c\'",pcVar11,(ulong)(uint)pmVar4[uVar9].d_char);
          sVar6 = utf8_strlen(nam);
          if (sVar6 < 0x28) {
            file_putf(fh,"%s%*s",nam,(ulong)(0x28 - (int)sVar6)," ");
          }
          else {
            if (sVar6 != 0x28) {
              utf8_clipto(nam,0x28);
            }
            file_putf(fh,"%s",nam);
          }
          file_putf(fh,"%4s%4s%6s%8s%4s  %11.11s\n",lev,rar,spd,hp,ac,exp);
          uVar14 = uVar14 + 1;
        } while (uVar12 != uVar14);
      }
    }
    file_putf(fh,"\n");
    mem_free(base);
    _Var5 = file_close(fh);
    pcVar11 = "Cannot close spoiler file.";
    if (_Var5) {
      pcVar11 = "Successfully created a spoiler file.";
    }
  }
  msg(pcVar11);
  return;
}

Assistant:

void spoil_mon_desc(const char *fname)
{
	int i, n = 0;

	char buf[1024];

	char nam[80];
	char lev[80];
	char rar[80];
	char spd[80];
	char ac[80];
	char hp[80];
	char exp[80];

	uint16_t *who;

	/* Build the filename */
	path_build(buf, sizeof(buf), ANGBAND_DIR_USER, fname);
	fh = file_open(buf, MODE_WRITE, FTYPE_TEXT);

	/* Oops */
	if (!fh) {
		msg("Cannot create spoiler file.");
		return;
	}

	/* Dump the header */
	file_putf(fh, "Monster Spoilers for %s\n", buildid);
	file_putf(fh, "------------------------------------------\n\n");

	/* Dump the header */
	file_putf(fh, "%-40.40s%4s%4s%6s%8s%4s  %11.11s\n",
	        "Name", "Lev", "Rar", "Spd", "Hp", "Ac", "Visual Info");
	file_putf(fh, "%-40.40s%4s%4s%6s%8s%4s  %11.11s\n",
	        "----", "---", "---", "---", "--", "--", "-----------");

	/* Allocate the "who" array */
	who = mem_zalloc(z_info->r_max * sizeof(uint16_t));

	/* Scan the monsters (except the ghost) */
	for (i = 1; i < z_info->r_max - 1; i++) {
		struct monster_race *race = &r_info[i];

		/* Use that monster */
		if (race->name) who[n++] = (uint16_t)i;
	}

	/* Sort the array by dungeon depth of monsters */
	sort(who, n, sizeof(*who), cmp_monsters);

	/* Scan again */
	for (i = 0; i < n; i++) {
		struct monster_race *race = &r_info[who[i]];
		const char *name = race->name;
		size_t u8len;

		/* Get the "name" */
		if (rf_has(race->flags, RF_QUESTOR))
			strnfmt(nam, sizeof(nam), "[Q] %s", name);
		else if (rf_has(race->flags, RF_UNIQUE))
			strnfmt(nam, sizeof(nam), "[U] %s", name);
		else
			strnfmt(nam, sizeof(nam), "The %s", name);

		/* Level */
		strnfmt(lev, sizeof(lev), "%d", race->level);

		/* Rarity */
		strnfmt(rar, sizeof(rar), "%d", race->rarity);

		/* Speed */
		if (race->speed >= 110)
			strnfmt(spd, sizeof(spd), "+%d", (race->speed - 110));
		else
			strnfmt(spd, sizeof(spd), "-%d", (110 - race->speed));

		/* Armor Class */
		strnfmt(ac, sizeof(ac), "%d", race->ac);

		/* Hitpoints */
		strnfmt(hp, sizeof(hp), "%d", race->avg_hp);

		/* Experience */
		strnfmt(exp, sizeof(exp), "%ld", (long)(race->mexp));

		/* Hack -- use visual instead */
		strnfmt(exp, sizeof(exp), "%s '%c'", attr_to_text(race->d_attr),
				race->d_char);

		/*
		 * Dump the info.  The rationale for handling the first column
		 * separately is the same as in spoil_obj_desc():  better
		 * alignment if there are multibyte characters in the name.
		 */
		u8len = utf8_strlen(nam);
		if (u8len < 40) {
			file_putf(fh, "%s%*s", nam, (int) (40 - u8len), " ");
		} else {
			if (u8len > 40) {
				utf8_clipto(nam, 40);
			}
			file_putf(fh, "%s", nam);
		}
		file_putf(fh, "%4s%4s%6s%8s%4s  %11.11s\n",
		        lev, rar, spd, hp, ac, exp);
	}

	/* End it */
	file_putf(fh, "\n");

	/* Free the "who" array */
	mem_free(who);

	/* Check for errors */
	if (!file_close(fh)) {
		msg("Cannot close spoiler file.");
		return;
	}

	/* Worked */
	msg("Successfully created a spoiler file.");
}